

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_get_optional_asn1(CBS *cbs,CBS *out,int *out_present,CBS_ASN1_TAG tag)

{
  int iVar1;
  int iVar2;
  CBS_ASN1_TAG actual_tag;
  CBS copy;
  CBS_ASN1_TAG local_3c;
  CBS local_38;
  
  local_38.data = cbs->data;
  local_38.len = cbs->len;
  iVar1 = parse_asn1_tag(&local_38,&local_3c);
  iVar2 = 0;
  if ((iVar1 != 0) && (iVar2 = 0, local_3c == tag)) {
    iVar2 = 1;
    iVar1 = cbs_get_asn1(cbs,out,tag,1);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if (out_present != (int *)0x0) {
    *out_present = iVar2;
  }
  return 1;
}

Assistant:

int CBS_get_optional_asn1(CBS *cbs, CBS *out, int *out_present,
                          CBS_ASN1_TAG tag) {
  int present = 0;

  if (CBS_peek_asn1_tag(cbs, tag)) {
    if (!CBS_get_asn1(cbs, out, tag)) {
      return 0;
    }
    present = 1;
  }

  if (out_present != NULL) {
    *out_present = present;
  }

  return 1;
}